

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O2

OrphanBuilder *
capnp::_::OrphanBuilder::initStruct
          (OrphanBuilder *__return_storage_ptr__,BuilderArena *arena,CapTableBuilder *capTable,
          StructSize size)

{
  undefined1 auVar1 [16];
  AllocateResult AVar2;
  
  __return_storage_ptr__->capTable = (CapTableBuilder *)0x0;
  __return_storage_ptr__->location = (word *)0x0;
  (__return_storage_ptr__->tag).content = 0;
  __return_storage_ptr__->segment = (SegmentBuilder *)0x0;
  if (arena == (BuilderArena *)0x0) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = __return_storage_ptr__;
    AVar2 = (AllocateResult)(auVar1 << 0x40);
  }
  else {
    AVar2 = BuilderArena::allocate(arena,((uint)size & 0xffff) + ((uint)size >> 0x10));
  }
  *(undefined4 *)&(__return_storage_ptr__->tag).content = 0xfffffffc;
  *(StructDataWordCount *)((long)&(__return_storage_ptr__->tag).content + 4) = size.data;
  *(StructPointerCount *)((long)&(__return_storage_ptr__->tag).content + 6) = size.pointers;
  __return_storage_ptr__->segment = AVar2.segment;
  __return_storage_ptr__->capTable = capTable;
  __return_storage_ptr__->location = AVar2.words;
  return __return_storage_ptr__;
}

Assistant:

OrphanBuilder OrphanBuilder::initStruct(
    BuilderArena* arena, CapTableBuilder* capTable, StructSize size) {
  OrphanBuilder result;
  StructBuilder builder = WireHelpers::initStructPointer(
      result.tagAsPtr(), nullptr, capTable, size, arena);
  result.segment = builder.segment;
  result.capTable = capTable;
  result.location = builder.getLocation();
  return result;
}